

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O3

MPP_RET os_allocator_dma_heap_alloc(void *ctx,MppBufferInfo *info)

{
  MPP_RET MVar1;
  int *piVar2;
  char *pcVar3;
  
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_dma_heap","does not accept NULL input\n","os_allocator_dma_heap_alloc");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar1 = ioctl(*(int *)((long)ctx + 4),0xc0184800);
    if (MVar1 < MPP_OK) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      _mpp_log_l(2,"mpp_dma_heap","ioctl alloc failed for %s\n",(char *)0x0,pcVar3);
    }
    else {
      if (((byte)dma_heap_debug & 4) != 0) {
        _mpp_log_l(4,"mpp_dma_heap","ioctl alloc get fd %d\n",(char *)0x0,0);
      }
      info->fd = 0;
    }
    if (((byte)dma_heap_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dma_heap","dev %d alloc %3d size %d\n",(char *)0x0,
                 (ulong)*(uint *)((long)ctx + 4),(ulong)(uint)info->fd,info->size);
    }
    if (MVar1 == MPP_OK) {
      info->ptr = (void *)0x0;
      MVar1 = MPP_OK;
    }
    else {
      _mpp_log_l(2,"mpp_dma_heap","dma_heap_alloc failed ret %d\n","os_allocator_dma_heap_alloc",
                 (ulong)(uint)MVar1);
    }
  }
  return MVar1;
}

Assistant:

static MPP_RET os_allocator_dma_heap_alloc(void *ctx, MppBufferInfo *info)
{
    MPP_RET ret = MPP_OK;
    allocator_ctx_dmaheap *p = NULL;

    if (NULL == ctx) {
        mpp_err_f("does not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    p = (allocator_ctx_dmaheap *)ctx;

    ret = dma_heap_alloc(p->device, info->size, (RK_S32 *)&info->fd, p->flags);

    dma_heap_dbg_ops("dev %d alloc %3d size %d\n", p->device, info->fd, info->size);

    if (ret) {
        mpp_err_f("dma_heap_alloc failed ret %d\n", ret);
        return ret;
    }

    info->ptr = NULL;
    return ret;
}